

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void * luaM_growaux_(lua_State *L,void *block,int *size,size_t size_elems,int limit,char *errormsg)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *pvVar4;
  ulong uVar5;
  
  iVar1 = *size;
  uVar5 = (ulong)((uint)limit >> 1);
  if (iVar1 < (int)((uint)limit >> 1)) {
    limit = 4;
    if (4 < iVar1 * 2) {
      limit = iVar1 * 2;
    }
  }
  else if (limit <= iVar1) goto LAB_0010d96b;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = size_elems;
  auVar3 = ZEXT816(0) << 0x40 | ZEXT816(0xfffffffffffffffd);
  uVar5 = SUB168(auVar3 % auVar2,0);
  if ((ulong)(long)(limit + 1) <= SUB168(auVar3 / auVar2,0)) {
    pvVar4 = luaM_realloc_(L,block,(long)*size * size_elems,(long)limit * size_elems);
    *size = limit;
    return pvVar4;
  }
  errormsg = "memory allocation error: block too big";
LAB_0010d96b:
  luaG_runerror(L,errormsg,uVar5);
}

Assistant:

static void*luaM_growaux_(lua_State*L,void*block,int*size,size_t size_elems,
int limit,const char*errormsg){
void*newblock;
int newsize;
if(*size>=limit/2){
if(*size>=limit)
luaG_runerror(L,errormsg);
newsize=limit;
}
else{
newsize=(*size)*2;
if(newsize<4)
newsize=4;
}
newblock=luaM_reallocv(L,block,*size,newsize,size_elems);
*size=newsize;
return newblock;
}